

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_test.cc
# Opt level: O3

void __thiscall DHTest_InvalidParameters_Test::TestBody(DHTest_InvalidParameters_Test *this)

{
  undefined1 auVar1 [8];
  undefined8 uVar2;
  int iVar3;
  DH *pDVar4;
  _Head_base<0UL,_bignum_st_*,_false> _Var5;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<DH> dh;
  UniquePtr<BIGNUM> large;
  UniquePtr<BIGNUM> g;
  UniquePtr<BIGNUM> p;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [8];
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  undefined1 local_48 [32];
  AssertHelper local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  _Head_base<0UL,_bignum_st_*,_false> local_18;
  
  local_18._M_head_impl = BN_get_rfc3526_prime_2048((BIGNUM *)0x0);
  local_70[0] = (internal)((DH *)local_18._M_head_impl != (DH *)0x0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((DH *)local_18._M_head_impl == (DH *)0x0) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,local_70,(AssertionResult *)0x54bfec,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x1b8,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if ((DH *)local_48._0_8_ != (DH *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if ((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    goto LAB_0025fc41;
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)BN_new();
  local_70[0] = (internal)((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,local_70,(AssertionResult *)0x547f32,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x1ba,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_58);
LAB_0025f87b:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((dh_st *)local_48._0_8_ != (dh_st *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 !=
        (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  else {
    iVar3 = BN_set_word((BIGNUM *)local_20._M_head_impl,2);
    local_70[0] = (internal)(iVar3 != 0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,local_70,(AssertionResult *)"BN_set_word(g.get(), 2)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x1bb,(char *)local_48._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_58);
      goto LAB_0025f87b;
    }
    BN_set_negative((BIGNUM *)local_18._M_head_impl,1);
    NewDHGroup((BIGNUM *)local_58,local_18._M_head_impl,(BIGNUM *)0x0);
    local_70[0] = (internal)
                  ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 !=
                  (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 ==
        (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,local_70,(AssertionResult *)0x533a24,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x1c0,(char *)local_48._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_50);
LAB_0025f9f8:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if (local_48._0_8_ != (long)local_48 + 0x10) {
        operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
      }
      if ((DH *)local_50._M_head_impl != (DH *)0x0) {
        (**(code **)&((BIGNUM *)(local_50._M_head_impl)->d)->width)();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    else {
      pDVar4 = (DH *)0x0;
      BN_set_negative((BIGNUM *)local_18._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_58,pDVar4);
      BN_set_negative((BIGNUM *)local_20._M_head_impl,1);
      NewDHGroup((BIGNUM *)local_48,local_18._M_head_impl,(BIGNUM *)0x0);
      uVar2 = local_48._0_8_;
      auVar1 = local_58;
      local_48._0_8_ = (DH *)0x0;
      local_58 = (undefined1  [8])uVar2;
      if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)auVar1 !=
          (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
        DH_free((DH *)auVar1);
      }
      std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<dh_st,_bssl::internal::Deleter> *)local_48);
      local_70[0] = (internal)(local_58 != (undefined1  [8])0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_58 == (undefined1  [8])0x0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,local_70,(AssertionResult *)0x533a24,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1c7,(char *)local_48._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_50);
        goto LAB_0025f9f8;
      }
      pDVar4 = (DH *)0x0;
      BN_set_negative((BIGNUM *)local_20._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_58,pDVar4);
      NewDHGroup((BIGNUM *)local_48,local_18._M_head_impl,(BIGNUM *)0x0);
      uVar2 = local_48._0_8_;
      auVar1 = local_58;
      local_48._0_8_ = (DH *)0x0;
      local_58 = (undefined1  [8])uVar2;
      if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)auVar1 !=
          (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
        DH_free((DH *)auVar1);
      }
      std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<dh_st,_bssl::internal::Deleter> *)local_48);
      local_70[0] = (internal)
                    ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 !=
                    (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 ==
          (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,local_70,(AssertionResult *)0x533a24,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1cd,(char *)local_48._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_50);
        goto LAB_0025f9f8;
      }
      pDVar4 = (DH *)0x0;
      BN_set_negative((BIGNUM *)local_20._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_58,pDVar4);
      local_50._M_head_impl = (bignum_st *)BN_new();
      iVar3 = BN_set_bit((BIGNUM *)local_50._M_head_impl,0);
      local_70[0] = (internal)(iVar3 != 0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,local_70,(AssertionResult *)"BN_set_bit(large.get(), 0)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1d3,(char *)local_48._0_8_);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
LAB_0025fbdc:
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if ((DH *)local_48._0_8_ != (DH *)(local_48 + 0x10)) {
          operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
      else {
        iVar3 = BN_set_bit((BIGNUM *)local_50._M_head_impl,10000000);
        local_70[0] = (internal)(iVar3 != 0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,local_70,
                     (AssertionResult *)"BN_set_bit(large.get(), 10000000)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1d4,(char *)local_48._0_8_);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
          goto LAB_0025fbdc;
        }
        _Var5._M_head_impl = local_50._M_head_impl;
        NewDHGroup((BIGNUM *)local_48,local_50._M_head_impl,(BIGNUM *)0x0);
        uVar2 = local_48._0_8_;
        auVar1 = local_58;
        local_48._0_8_ = (DH *)0x0;
        local_58 = (undefined1  [8])uVar2;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)auVar1 !=
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          DH_free((DH *)auVar1);
        }
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)local_48);
        local_70[0] = (internal)
                      ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 !=
                      (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 ==
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,local_70,(AssertionResult *)0x533a24,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1d6,(char *)local_48._0_8_);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
          goto LAB_0025fbdc;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_58,(DH *)_Var5._M_head_impl);
        _Var5._M_head_impl = local_18._M_head_impl;
        NewDHGroup((BIGNUM *)local_48,local_18._M_head_impl,local_50._M_head_impl);
        uVar2 = local_48._0_8_;
        auVar1 = local_58;
        local_48._0_8_ = (DH *)0x0;
        local_58 = (undefined1  [8])uVar2;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)auVar1 !=
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          DH_free((DH *)auVar1);
        }
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)local_48);
        local_70[0] = (internal)
                      ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 !=
                      (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)local_58 ==
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,local_70,(AssertionResult *)0x533a24,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1db,(char *)local_48._0_8_);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
          goto LAB_0025fbdc;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_58,(DH *)_Var5._M_head_impl);
        iVar3 = DH_generate_parameters_ex((DH *)local_58,20000,5,(BN_GENCB *)0x0);
        local_70[0] = (internal)(iVar3 == 0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_70[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,local_70,
                     (AssertionResult *)"DH_generate_parameters_ex(dh.get(), 20000, 5, nullptr)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1e0,(char *)local_48._0_8_);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
          goto LAB_0025fbdc;
        }
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
    }
    std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<dh_st,_bssl::internal::Deleter> *)local_58);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
LAB_0025fc41:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST(DHTest, InvalidParameters) {
  auto check_invalid_group = [](DH *dh) {
    // All operations on egregiously invalid groups should fail.
    EXPECT_FALSE(DH_generate_key(dh));
    int check_result;
    EXPECT_FALSE(DH_check(dh, &check_result));
    bssl::UniquePtr<BIGNUM> pub_key(BN_new());
    ASSERT_TRUE(pub_key);
    ASSERT_TRUE(BN_set_u64(pub_key.get(), 42));
    EXPECT_FALSE(DH_check_pub_key(dh, pub_key.get(), &check_result));
    uint8_t buf[1024];
    EXPECT_EQ(DH_compute_key(buf, pub_key.get(), dh), -1);
    EXPECT_EQ(DH_compute_key_padded(buf, pub_key.get(), dh), -1);
  };

  bssl::UniquePtr<BIGNUM> p(BN_get_rfc3526_prime_2048(nullptr));
  ASSERT_TRUE(p);
  bssl::UniquePtr<BIGNUM> g(BN_new());
  ASSERT_TRUE(g);
  ASSERT_TRUE(BN_set_word(g.get(), 2));

  // p is negative.
  BN_set_negative(p.get(), 1);
  bssl::UniquePtr<DH> dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(p.get(), 0);
  check_invalid_group(dh.get());

  // g is negative.
  BN_set_negative(g.get(), 1);
  dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // g is not reduced mod p.
  dh = NewDHGroup(p.get(), /*q=*/nullptr, p.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // p is too large.
  bssl::UniquePtr<BIGNUM> large(BN_new());
  ASSERT_TRUE(BN_set_bit(large.get(), 0));
  ASSERT_TRUE(BN_set_bit(large.get(), 10000000));
  dh = NewDHGroup(large.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // q is too large.
  dh = NewDHGroup(p.get(), large.get(), g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // Attempting to generate too large of a Diffie-Hellman group should fail.
  EXPECT_FALSE(
      DH_generate_parameters_ex(dh.get(), 20000, DH_GENERATOR_5, nullptr));
}